

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd_b<unsigned_short>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  byte *pbVar1;
  long lVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 N_00;
  unsigned_short uVar9;
  undefined6 extraout_var;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  uchar **ppuVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  uchar **ppuVar19;
  uint uVar20;
  byte bVar21;
  undefined2 uVar22;
  ushort uVar23;
  byte bVar24;
  undefined2 uVar25;
  ulong uVar26;
  undefined2 uVar27;
  ulong uVar28;
  ulong uVar29;
  size_t N_01;
  ulong uVar30;
  ulong uVar31;
  char cVar32;
  char cVar40;
  char cVar41;
  char cVar43;
  short sVar42;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar39 [16];
  short sVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  char local_b0;
  uint local_ac;
  ulong local_a8;
  undefined1 local_78 [16];
  ulong local_68;
  size_t local_58;
  ulong local_50;
  long local_48 [3];
  short sVar33;
  undefined4 uVar34;
  undefined6 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  
  if (0x1f < N) {
    local_58 = depth + 2;
    N_01 = N;
    do {
      uVar9 = pseudo_median<unsigned_short>(strings,N_01,depth);
      auVar8 = _DAT_001f3b40;
      auVar7 = _DAT_001f3b30;
      auVar6 = _DAT_001f3b20;
      local_78 = (undefined1  [16])0x0;
      local_68 = 0;
      uVar10 = N_01 & 0xfffffffffffffff0;
      if (uVar10 != 0) {
        auVar39 = ZEXT416((uint)CONCAT62(extraout_var,uVar9));
        auVar39 = pshuflw(auVar39,auVar39,0);
        cVar32 = auVar39[0];
        cVar40 = auVar39[1];
        sVar33 = CONCAT11(cVar40 + DAT_001f3b20._1_1_,cVar32 + DAT_001f3b20);
        cVar41 = auVar39[2];
        cVar43 = auVar39[3];
        uVar34 = CONCAT13(cVar43 + DAT_001f3b20._3_1_,CONCAT12(cVar41 + DAT_001f3b20._2_1_,sVar33));
        uVar35 = CONCAT15(cVar40 + DAT_001f3b20._5_1_,CONCAT14(cVar32 + DAT_001f3b20._4_1_,uVar34));
        uVar36 = CONCAT17(cVar43 + DAT_001f3b20._7_1_,CONCAT16(cVar41 + DAT_001f3b20._6_1_,uVar35));
        auVar37._0_10_ =
             CONCAT19(cVar40 + DAT_001f3b20._9_1_,CONCAT18(cVar32 + DAT_001f3b20._8_1_,uVar36));
        auVar37[10] = cVar41 + DAT_001f3b20._10_1_;
        auVar37[0xb] = cVar43 + DAT_001f3b20._11_1_;
        auVar38[0xc] = cVar32 + DAT_001f3b20._12_1_;
        auVar38._0_12_ = auVar37;
        auVar38[0xd] = cVar40 + DAT_001f3b20._13_1_;
        auVar39[0xe] = cVar41 + DAT_001f3b20._14_1_;
        auVar39._0_14_ = auVar38;
        auVar39[0xf] = cVar43 + DAT_001f3b20._15_1_;
        uVar14 = 0;
        local_50 = uVar10;
        do {
          lVar18 = 0;
          do {
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x10);
          puVar3 = strings[uVar14];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar31 = 0;
          }
          else {
            uVar31 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 2];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar30 = 0;
          }
          else {
            uVar30 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 4];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar15 = 0;
          }
          else {
            uVar15 = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 6];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar12 = 0;
          }
          else {
            uVar12 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 8];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar27 = 0;
          }
          else {
            uVar27 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 10];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar25 = 0;
          }
          else {
            uVar25 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 0xc];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar22 = 0;
          }
          else {
            uVar22 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 0xe];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            local_a8 = 0;
          }
          else {
            local_a8 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 1];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            local_ac = 0;
          }
          else {
            local_ac = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 3];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar17 = 0;
          }
          else {
            uVar17 = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 5];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar20 = 0;
          }
          else {
            uVar20 = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 7];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar23 = 0;
          }
          else {
            uVar23 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 9];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar26 = 0;
          }
          else {
            uVar26 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 0xb];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar28 = 0;
          }
          else {
            uVar28 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 0xd];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar29 = 0;
          }
          else {
            uVar29 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          puVar3 = strings[uVar14 + 0xf];
          if (puVar3 == (uchar *)0x0) goto LAB_001b22a7;
          if (puVar3[depth] == '\0') {
            uVar16 = 0;
          }
          else {
            uVar16 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          auVar50._8_8_ = (ulong)CONCAT24(uVar22,CONCAT22(uVar25,uVar27)) | local_a8 << 0x30;
          auVar50._0_8_ = uVar31 | uVar30 << 0x10 | (ulong)uVar15 << 0x20 | (ulong)uVar12 << 0x30;
          auVar52._8_8_ = uVar26 | uVar28 << 0x10 | uVar29 << 0x20 | uVar16 << 0x30;
          auVar52._0_8_ =
               (ulong)local_ac | (ulong)uVar17 << 0x10 | (ulong)uVar20 << 0x20 |
               (ulong)uVar23 << 0x30;
          auVar50 = auVar50 ^ auVar6;
          auVar52 = auVar52 ^ auVar6;
          auVar55._0_2_ = -(ushort)(auVar50._0_2_ == sVar33);
          sVar42 = (short)((uint)uVar34 >> 0x10);
          auVar55._2_2_ = -(ushort)(auVar50._2_2_ == sVar42);
          sVar44 = (short)((uint6)uVar35 >> 0x20);
          auVar55._4_2_ = -(ushort)(auVar50._4_2_ == sVar44);
          sVar45 = (short)((ulong)uVar36 >> 0x30);
          auVar55._6_2_ = -(ushort)(auVar50._6_2_ == sVar45);
          sVar46 = (short)((unkuint10)auVar37._0_10_ >> 0x40);
          auVar55._8_2_ = -(ushort)(auVar50._8_2_ == sVar46);
          sVar47 = auVar37._10_2_;
          auVar55._10_2_ = -(ushort)(auVar50._10_2_ == sVar47);
          sVar48 = auVar38._12_2_;
          auVar55._12_2_ = -(ushort)(auVar50._12_2_ == sVar48);
          sVar49 = auVar39._14_2_;
          auVar55._14_2_ = -(ushort)(auVar50._14_2_ == sVar49);
          auVar51._0_2_ = -(ushort)(sVar33 < auVar50._0_2_);
          auVar51._2_2_ = -(ushort)(sVar42 < auVar50._2_2_);
          auVar51._4_2_ = -(ushort)(sVar44 < auVar50._4_2_);
          auVar51._6_2_ = -(ushort)(sVar45 < auVar50._6_2_);
          auVar51._8_2_ = -(ushort)(sVar46 < auVar50._8_2_);
          auVar51._10_2_ = -(ushort)(sVar47 < auVar50._10_2_);
          auVar51._12_2_ = -(ushort)(sVar48 < auVar50._12_2_);
          auVar51._14_2_ = -(ushort)(sVar49 < auVar50._14_2_);
          auVar56._0_2_ = -(ushort)(auVar52._0_2_ == sVar33);
          auVar56._2_2_ = -(ushort)(auVar52._2_2_ == sVar42);
          auVar56._4_2_ = -(ushort)(auVar52._4_2_ == sVar44);
          auVar56._6_2_ = -(ushort)(auVar52._6_2_ == sVar45);
          auVar56._8_2_ = -(ushort)(auVar52._8_2_ == sVar46);
          auVar56._10_2_ = -(ushort)(auVar52._10_2_ == sVar47);
          auVar56._12_2_ = -(ushort)(auVar52._12_2_ == sVar48);
          auVar56._14_2_ = -(ushort)(auVar52._14_2_ == sVar49);
          auVar53._0_2_ = -(ushort)(sVar33 < auVar52._0_2_);
          auVar53._2_2_ = -(ushort)(sVar42 < auVar52._2_2_);
          auVar53._4_2_ = -(ushort)(sVar44 < auVar52._4_2_);
          auVar53._6_2_ = -(ushort)(sVar45 < auVar52._6_2_);
          auVar53._8_2_ = -(ushort)(sVar46 < auVar52._8_2_);
          auVar53._10_2_ = -(ushort)(sVar47 < auVar52._10_2_);
          auVar53._12_2_ = -(ushort)(sVar48 < auVar52._12_2_);
          auVar53._14_2_ = -(ushort)(sVar49 < auVar52._14_2_);
          auVar50 = auVar53 & auVar8 | auVar56 & auVar7;
          auVar54._0_8_ = auVar50._0_8_ << 8;
          auVar54._8_8_ = auVar50._8_8_ << 8;
          *(undefined1 (*) [16])(oracle + uVar14) = auVar54 | auVar51 & auVar8 | auVar55 & auVar7;
          uVar14 = uVar14 + 0x10;
        } while (uVar14 < uVar10);
      }
      if (uVar10 != N_01) {
        do {
          puVar3 = strings[uVar10];
          if (puVar3 == (uchar *)0x0) {
LAB_001b22a7:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                          ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
          }
          if (puVar3[depth] == '\0') {
            uVar12 = 0;
          }
          else {
            uVar12 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
          }
          oracle[uVar10] = (uVar9 < uVar12) * '\x02' | uVar12 == uVar9;
          uVar10 = uVar10 + 1;
        } while (uVar10 < N_01);
      }
      lVar11 = N_01 + (N_01 == 0);
      lVar18 = 0;
      do {
        *(long *)(local_78 + (ulong)oracle[lVar18] * 8) =
             *(long *)(local_78 + (ulong)oracle[lVar18] * 8) + 1;
        N = local_68;
        lVar18 = lVar18 + 1;
      } while (lVar11 != lVar18);
      uVar36 = local_78._0_8_;
      N_00 = local_78._8_8_;
      if (local_78._8_8_ + local_78._0_8_ + local_68 != N_01) {
        __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                      ,0x166,
                      "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned short]"
                     );
      }
      local_48[0] = 0;
      local_48[1] = local_78._0_8_;
      local_48[2] = local_78._8_8_ + local_78._0_8_;
      lVar18 = 0;
      do {
        puVar3 = strings[lVar18];
        pbVar1 = oracle + lVar18;
        lVar18 = lVar18 + 1;
        lVar2 = local_48[*pbVar1];
        local_48[*pbVar1] = lVar2 + 1;
        sorted[lVar2] = puVar3;
      } while (lVar11 != lVar18);
      memcpy(strings,sorted,N_01 << 3);
      multikey_simd_b<unsigned_short>(strings,uVar36,depth,sorted,oracle);
      local_b0 = (char)uVar9;
      if (local_b0 != '\0') {
        multikey_simd_b<unsigned_short>(strings + uVar36,N_00,local_58,sorted,oracle);
      }
      strings = strings + uVar36 + N_00;
      N_01 = N;
    } while (0x1f < N);
  }
  if (1 < N) {
    ppuVar13 = strings;
    do {
      puVar3 = ppuVar13[1];
      ppuVar13 = ppuVar13 + 1;
      for (ppuVar19 = ppuVar13; strings < ppuVar19; ppuVar19 = ppuVar19 + -1) {
        puVar4 = ppuVar19[-1];
        bVar21 = puVar4[depth];
        bVar24 = puVar3[depth];
        if ((bVar21 != 0) && (lVar18 = depth + 1, bVar21 == bVar24)) {
          do {
            bVar21 = puVar4[lVar18];
            bVar24 = puVar3[lVar18];
            if (bVar21 == 0) break;
            lVar18 = lVar18 + 1;
          } while (bVar21 == bVar24);
        }
        if (bVar21 <= bVar24) break;
        *ppuVar19 = puVar4;
      }
      iVar5 = (int)N;
      *ppuVar19 = puVar3;
      N = (size_t)(iVar5 - 1);
    } while (2 < iVar5);
  }
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}